

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TtScc6(word wTruth,int ck)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  
  if (wTruth == 0) {
    iVar1 = 0;
  }
  else {
    piVar3 = Abc_TtCountOnesInCofsFast6_rec::bit_count;
    iVar1 = 0;
    for (uVar2 = 0; uVar2 != 0x40; uVar2 = uVar2 + 1) {
      if ((wTruth >> (uVar2 & 0x3f) & 1) != 0) {
        iVar1 = iVar1 + (1 << ((char)*piVar3 + (char)ck & 0x1fU));
      }
      piVar3 = piVar3 + 1;
    }
  }
  return iVar1;
}

Assistant:

static int Abc_TtScc6(word wTruth, int ck)
{
    int i;
    int sum = 0;
    if (!wTruth) return 0;
    for (i = 0; i < 64; i++)
        if (wTruth & (word)1 << i) {
            int ci = Abc_TtBitCount8[i] + ck;
            sum += shiftFunc(ci);
        }
    return sum;
}